

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t icu_63::TimeZoneFormat::parseAbuttingAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,OffsetFields minFields,
                  OffsetFields maxFields,UBool fixedHourWidth)

{
  bool bVar1;
  char16_t cVar2;
  int32_t ei;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int local_80;
  int local_74;
  int iStack_70;
  UBool bParsed;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t digit;
  uint uStack_5c;
  UChar uch;
  int32_t idx;
  int32_t numDigits;
  int32_t digits [6];
  int32_t maxDigits;
  int32_t minDigits;
  int32_t start;
  UBool fixedHourWidth_local;
  OffsetFields maxFields_local;
  OffsetFields minFields_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  
  ei = ParsePosition::getIndex(pos);
  iVar3 = (minFields + FIELDS_HM) * 2 - (uint)(fixedHourWidth == '\0');
  memset(&idx,0,0x18);
  uStack_5c = 0;
  digit = ei;
  while( true ) {
    bVar1 = false;
    if ((int)uStack_5c < (int)((maxFields + FIELDS_HM) * 2)) {
      iVar4 = UnicodeString::length(text);
      bVar1 = digit < iVar4;
    }
    if (!bVar1) break;
    cVar2 = UnicodeString::charAt(text,digit);
    if (((ushort)cVar2 < 0x30) || (0x39 < (ushort)cVar2)) {
      local_80 = -1;
    }
    else {
      local_80 = (ushort)cVar2 - 0x30;
    }
    if (local_80 < 0) break;
    (&idx)[(int)uStack_5c] = local_80;
    uStack_5c = uStack_5c + 1;
    digit = digit + 1;
  }
  if ((fixedHourWidth != '\0') && ((uStack_5c & 1) != 0)) {
    uStack_5c = uStack_5c - 1;
  }
  if ((int)uStack_5c < iVar3) {
    ParsePosition::setErrorIndex(pos,ei);
    text_local._4_4_ = 0;
  }
  else {
    bVar1 = false;
    while( true ) {
      sec = 0;
      iStack_70 = 0;
      local_74 = 0;
      if ((int)uStack_5c < iVar3) break;
      switch(uStack_5c) {
      case 1:
        sec = idx;
        break;
      case 2:
        sec = idx * 10 + numDigits;
        break;
      case 3:
        sec = idx;
        iStack_70 = numDigits * 10 + digits[0];
        break;
      case 4:
        sec = idx * 10 + numDigits;
        iStack_70 = digits[0] * 10 + digits[1];
        break;
      case 5:
        sec = idx;
        iStack_70 = numDigits * 10 + digits[0];
        local_74 = digits[1] * 10 + digits[2];
        break;
      case 6:
        sec = idx * 10 + numDigits;
        iStack_70 = digits[0] * 10 + digits[1];
        local_74 = digits[2] * 10 + digits[3];
      }
      if (((sec < 0x18) && (iStack_70 < 0x3c)) && (local_74 < 0x3c)) {
        bVar1 = true;
        break;
      }
      iVar5 = 1;
      if (fixedHourWidth != '\0') {
        iVar5 = 2;
      }
      uStack_5c = uStack_5c - iVar5;
    }
    if (bVar1) {
      ParsePosition::setIndex(pos,ei + uStack_5c);
      text_local._4_4_ = ((sec * 0x3c + iStack_70) * 0x3c + local_74) * 1000;
    }
    else {
      ParsePosition::setErrorIndex(pos,ei);
      text_local._4_4_ = 0;
    }
  }
  return text_local._4_4_;
}

Assistant:

int32_t
TimeZoneFormat::parseAbuttingAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, OffsetFields minFields, OffsetFields maxFields, UBool fixedHourWidth) {
    int32_t start = pos.getIndex();

    int32_t minDigits = 2 * (minFields + 1) - (fixedHourWidth ? 0 : 1);
    int32_t maxDigits = 2 * (maxFields + 1);

    U_ASSERT(maxDigits <= MAX_OFFSET_DIGITS);

    int32_t digits[MAX_OFFSET_DIGITS] = {};
    int32_t numDigits = 0;
    int32_t idx = start;
    while (numDigits < maxDigits && idx < text.length()) {
        UChar uch = text.charAt(idx);
        int32_t digit = DIGIT_VAL(uch);
        if (digit < 0) {
            break;
        }
        digits[numDigits] = digit;
        numDigits++;
        idx++;
    }

    if (fixedHourWidth && (numDigits & 1)) {
        // Fixed digits, so the number of digits must be even number. Truncating.
        numDigits--;
    }

    if (numDigits < minDigits) {
        pos.setErrorIndex(start);
        return 0;
    }

    int32_t hour = 0, min = 0, sec = 0;
    UBool bParsed = FALSE;
    while (numDigits >= minDigits) {
        switch (numDigits) {
        case 1: //H
            hour = digits[0];
            break;
        case 2: //HH
            hour = digits[0] * 10 + digits[1];
            break;
        case 3: //Hmm
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            break;
        case 4: //HHmm
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            break;
        case 5: //Hmmss
            hour = digits[0];
            min = digits[1] * 10 + digits[2];
            sec = digits[3] * 10 + digits[4];
            break;
        case 6: //HHmmss
            hour = digits[0] * 10 + digits[1];
            min = digits[2] * 10 + digits[3];
            sec = digits[4] * 10 + digits[5];
            break;
        }

        if (hour <= MAX_OFFSET_HOUR && min <= MAX_OFFSET_MINUTE && sec <= MAX_OFFSET_SECOND) {
            // Successfully parsed
            bParsed = true;
            break;
        }

        // Truncating
        numDigits -= (fixedHourWidth ? 2 : 1);
        hour = min = sec = 0;
    }

    if (!bParsed) {
        pos.setErrorIndex(start);
        return 0;
    }
    pos.setIndex(start + numDigits);
    return ((((hour * 60) + min) * 60) + sec) * 1000;
}